

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_priority_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int32_t *piVar1;
  uint8_t u8extpri;
  int iVar2;
  uint32_t local_44;
  int rv;
  nghttp2_extpri extpri;
  nghttp2_priority_spec pri_spec;
  nghttp2_stream *stream;
  nghttp2_ext_priority_update *priority_update;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if (session->server == '\0') {
    __assert_fail("session->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x14ce,
                  "int nghttp2_session_on_priority_update_received(nghttp2_session *, nghttp2_frame *)"
                 );
  }
  piVar1 = (int32_t *)(frame->ext).payload;
  if ((frame->hd).stream_id == 0) {
    iVar2 = nghttp2_session_is_my_stream_id(session,*piVar1);
    if (iVar2 == 0) {
      pri_spec._4_8_ = nghttp2_session_get_stream_raw(session,*piVar1);
      if ((nghttp2_stream *)pri_spec._4_8_ == (nghttp2_stream *)0x0) {
        iVar2 = session_detect_idle_stream(session,*piVar1);
        if (iVar2 == 0) {
          iVar2 = session_call_on_frame_received(session,frame);
          return iVar2;
        }
        if ((ulong)(session->local_settings).max_concurrent_streams <=
            session->num_idle_streams + session->num_incoming_streams) {
          iVar2 = session_handle_invalid_connection
                            (session,frame,-0x1f9,"PRIORITY_UPDATE: max concurrent streams exceeded"
                            );
          return iVar2;
        }
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&extpri);
        pri_spec._4_8_ =
             nghttp2_session_open_stream
                       (session,*piVar1,'\0',(nghttp2_priority_spec *)&extpri,NGHTTP2_STREAM_IDLE,
                        (void *)0x0);
        if ((nghttp2_stream *)pri_spec._4_8_ == (nghttp2_stream *)0x0) {
          return -0x385;
        }
      }
      else if ((((nghttp2_stream *)pri_spec._4_8_)->flags & 0x20) != 0) {
        iVar2 = session_call_on_frame_received(session,frame);
        return iVar2;
      }
      local_44 = 3;
      rv = 0;
      iVar2 = nghttp2_http_parse_priority
                        ((nghttp2_extpri *)&stack0xffffffffffffffbc,*(uint8_t **)(piVar1 + 2),
                         *(size_t *)(piVar1 + 4));
      if (iVar2 == 0) {
        u8extpri = nghttp2_extpri_to_uint8((nghttp2_extpri *)&stack0xffffffffffffffbc);
        session_local._4_4_ =
             session_update_stream_priority(session,(nghttp2_stream *)pri_spec._4_8_,u8extpri);
        if ((session_local._4_4_ == 0) ||
           (iVar2 = nghttp2_is_fatal(session_local._4_4_), iVar2 == 0)) {
          session_local._4_4_ = session_call_on_frame_received(session,frame);
        }
      }
      else {
        session_local._4_4_ = session_call_on_frame_received(session,frame);
      }
    }
    else {
      iVar2 = session_detect_idle_stream(session,*piVar1);
      if (iVar2 == 0) {
        session_local._4_4_ = session_call_on_frame_received(session,frame);
      }
      else {
        session_local._4_4_ =
             session_handle_invalid_connection
                       (session,frame,-0x1f9,
                        "PRIORITY_UPDATE: prioritizing idle push is not allowed");
      }
    }
  }
  else {
    session_local._4_4_ =
         session_handle_invalid_connection(session,frame,-0x1f9,"PRIORITY_UPDATE: stream_id == 0");
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_priority_update_received(nghttp2_session *session,
                                                nghttp2_frame *frame) {
  nghttp2_ext_priority_update *priority_update;
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec;
  nghttp2_extpri extpri;
  int rv;

  assert(session->server);

  priority_update = frame->ext.payload;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "PRIORITY_UPDATE: stream_id == 0");
  }

  if (nghttp2_session_is_my_stream_id(session, priority_update->stream_id)) {
    if (session_detect_idle_stream(session, priority_update->stream_id)) {
      return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "PRIORITY_UPDATE: prioritizing idle push is not allowed");
    }

    /* TODO Ignore priority signal to a push stream for now */
    return session_call_on_frame_received(session, frame);
  }

  stream = nghttp2_session_get_stream_raw(session, priority_update->stream_id);
  if (stream) {
    /* Stream already exists. */
    if (stream->flags & NGHTTP2_STREAM_FLAG_IGNORE_CLIENT_PRIORITIES) {
      return session_call_on_frame_received(session, frame);
    }
  } else if (session_detect_idle_stream(session, priority_update->stream_id)) {
    if (session->num_idle_streams + session->num_incoming_streams >=
        session->local_settings.max_concurrent_streams) {
      return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "PRIORITY_UPDATE: max concurrent streams exceeded");
    }

    nghttp2_priority_spec_default_init(&pri_spec);
    stream = nghttp2_session_open_stream(session, priority_update->stream_id,
                                         NGHTTP2_FLAG_NONE, &pri_spec,
                                         NGHTTP2_STREAM_IDLE, NULL);
    if (!stream) {
      return NGHTTP2_ERR_NOMEM;
    }
  } else {
    return session_call_on_frame_received(session, frame);
  }

  extpri.urgency = NGHTTP2_EXTPRI_DEFAULT_URGENCY;
  extpri.inc = 0;

  rv = nghttp2_http_parse_priority(&extpri, priority_update->field_value,
                                   priority_update->field_value_len);
  if (rv != 0) {
    /* Just ignore field_value if it cannot be parsed. */
    return session_call_on_frame_received(session, frame);
  }

  rv = session_update_stream_priority(session, stream,
                                      nghttp2_extpri_to_uint8(&extpri));
  if (rv != 0) {
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }

  return session_call_on_frame_received(session, frame);
}